

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::deepCopy
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          *sr)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  undefined4 extraout_var_01;
  long *plVar4;
  
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  plVar4 = *(long **)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  if (plVar4 != *(long **)(CONCAT44(extraout_var_00,iVar2) + 8)) {
    do {
      puVar3 = (undefined8 *)operator_new(0x30);
      lVar1 = *plVar4;
      *puVar3 = &PTR__Configuration_00135200;
      puVar3[1] = *(undefined8 *)(lVar1 + 8);
      puVar3[2] = puVar3 + 4;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar3 + 2),*(long *)(lVar1 + 0x10),
                 *(long *)(lVar1 + 0x18) + *(long *)(lVar1 + 0x10));
      (*(this->
        super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
        ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,puVar3);
      plVar4 = plVar4 + 1;
      iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
    } while (plVar4 != *(long **)(CONCAT44(extraout_var_01,iVar2) + 8));
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }